

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_fee.cpp
# Opt level: O0

void __thiscall
FeeCalculator_CalculateFeeTest_Test::TestBody(FeeCalculator_CalculateFeeTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Amount AVar3;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Amount amt;
  long *in_stack_fffffffffffffec0;
  long *in_stack_fffffffffffffec8;
  AssertionResult *this_00;
  undefined6 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed6;
  undefined1 in_stack_fffffffffffffed7;
  char *in_stack_fffffffffffffed8;
  uint32_t in_stack_fffffffffffffee0;
  uint32_t in_stack_fffffffffffffee4;
  AssertHelper local_f0;
  Message local_e8;
  undefined8 local_e0;
  int64_t local_d8;
  AssertionResult local_d0;
  AssertHelper local_c0;
  Message local_b8;
  char *local_b0;
  undefined1 local_a8;
  char *local_a0;
  undefined1 local_98;
  AssertHelper local_90;
  Message local_88;
  undefined8 local_80;
  int64_t local_78;
  AssertionResult local_70;
  AssertHelper local_60;
  Message local_58 [2];
  char *local_48;
  undefined1 local_40;
  char *local_38;
  undefined1 local_30;
  Amount local_18;
  
  cfd::core::Amount::Amount(&local_18);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      AVar3 = cfd::FeeCalculator::CalculateFee
                        (in_stack_fffffffffffffee4,in_stack_fffffffffffffee0,
                         (uint64_t)in_stack_fffffffffffffed8);
      local_48 = (char *)AVar3.amount_;
      local_40 = AVar3.ignore_check_;
      local_38 = local_48;
      local_30 = local_40;
      local_18.amount_ = (int64_t)local_48;
      local_18.ignore_check_ = (bool)local_40;
    }
  }
  else {
    testing::Message::Message(local_58);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_fee.cpp"
               ,0x14,
               "Expected: (amt = FeeCalculator::CalculateFee(3000, 1000, 11000)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message((Message *)0x203478);
  }
  local_78 = cfd::core::Amount::GetSatoshiValue(&local_18);
  local_80 = 11000;
  testing::internal::EqHelper<false>::Compare<long,long>
            (in_stack_fffffffffffffed8,
             (char *)CONCAT17(in_stack_fffffffffffffed7,
                              CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)),
             in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_70);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x203568);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_fee.cpp"
               ,0x15,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message((Message *)0x2035c5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x20361d);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      AVar3 = cfd::FeeCalculator::CalculateFee
                        (CONCAT13(bVar1,(int3)in_stack_fffffffffffffee4),in_stack_fffffffffffffee0,
                         (uint64_t)in_stack_fffffffffffffed8);
      in_stack_fffffffffffffed8 = (char *)AVar3.amount_;
      in_stack_fffffffffffffed7 = AVar3.ignore_check_;
      local_b0 = in_stack_fffffffffffffed8;
      local_a8 = in_stack_fffffffffffffed7;
      local_a0 = in_stack_fffffffffffffed8;
      local_98 = in_stack_fffffffffffffed7;
      local_18.amount_ = (int64_t)in_stack_fffffffffffffed8;
      local_18.ignore_check_ = (bool)in_stack_fffffffffffffed7;
    }
  }
  else {
    testing::Message::Message(&local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_fee.cpp"
               ,0x17,
               "Expected: (amt = FeeCalculator::CalculateFee(3000, 3000, 10000)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message((Message *)0x203768);
  }
  local_d8 = cfd::core::Amount::GetSatoshiValue(&local_18);
  local_e0 = 30000;
  this_00 = &local_d0;
  testing::internal::EqHelper<false>::Compare<long,long>
            (in_stack_fffffffffffffed8,
             (char *)CONCAT17(in_stack_fffffffffffffed7,
                              CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)),
             (long *)this_00,in_stack_fffffffffffffec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x203843);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_fee.cpp"
               ,0x18,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::Message::~Message((Message *)0x203891);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2038dd);
  return;
}

Assistant:

TEST(FeeCalculator, CalculateFeeTest)
{
  Amount amt;
  EXPECT_NO_THROW((amt = FeeCalculator::CalculateFee(3000, 1000, 11000)));
  EXPECT_EQ(amt.GetSatoshiValue(), static_cast<int64_t>(11000));

  EXPECT_NO_THROW((amt = FeeCalculator::CalculateFee(3000, 3000, 10000)));
  EXPECT_EQ(amt.GetSatoshiValue(), static_cast<int64_t>(30000));
}